

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_constrain_all(REF_GRID ref_grid)

{
  REF_NODE pRVar1;
  uint uVar2;
  long lVar3;
  
  pRVar1 = ref_grid->node;
  lVar3 = 0;
  while( true ) {
    if (pRVar1->max <= lVar3) {
      return 0;
    }
    if ((-1 < pRVar1->global[lVar3]) &&
       (uVar2 = ref_geom_constrain(ref_grid,(REF_INT)lVar3), uVar2 != 0)) break;
    lVar3 = lVar3 + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x5fe,
         "ref_geom_constrain_all",(ulong)uVar2,"constrain node");
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_constrain_all(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_geom_constrain(ref_grid, node), "constrain node");
  }
  return REF_SUCCESS;
}